

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

xmlChar * xmlCatalogGetSGMLPublic(xmlHashTablePtr catal,xmlChar *pubID)

{
  int iVar1;
  xmlChar *pxVar2;
  void *pvVar3;
  xmlChar *name;
  
  if (catal == (xmlHashTablePtr)0x0) {
    return (xmlChar *)0x0;
  }
  pxVar2 = xmlCatalogNormalizePublic(pubID);
  if (pxVar2 == (xmlChar *)0x0) {
    pvVar3 = xmlHashLookup(catal,pubID);
    if (pvVar3 == (void *)0x0) {
      return (xmlChar *)0x0;
    }
    iVar1 = *(int *)((long)pvVar3 + 0x18);
  }
  else {
    name = (xmlChar *)0x0;
    if (*pxVar2 != '\0') {
      name = pxVar2;
    }
    pvVar3 = xmlHashLookup(catal,name);
    if (pvVar3 == (void *)0x0) {
      (*xmlFree)(pxVar2);
      return (xmlChar *)0x0;
    }
    iVar1 = *(int *)((long)pvVar3 + 0x18);
    (*xmlFree)(pxVar2);
  }
  if (iVar1 != 0xe) {
    return (xmlChar *)0x0;
  }
  return *(xmlChar **)((long)pvVar3 + 0x30);
}

Assistant:

static const xmlChar *
xmlCatalogGetSGMLPublic(xmlHashTablePtr catal, const xmlChar *pubID) {
    xmlCatalogEntryPtr entry;
    xmlChar *normid;

    if (catal == NULL)
	return(NULL);

    normid = xmlCatalogNormalizePublic(pubID);
    if (normid != NULL)
        pubID = (*normid != 0 ? normid : NULL);

    entry = (xmlCatalogEntryPtr) xmlHashLookup(catal, pubID);
    if (entry == NULL) {
	if (normid != NULL)
	    xmlFree(normid);
	return(NULL);
    }
    if (entry->type == SGML_CATA_PUBLIC) {
	if (normid != NULL)
	    xmlFree(normid);
	return(entry->URL);
    }
    if (normid != NULL)
        xmlFree(normid);
    return(NULL);
}